

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Results-ANN-Logic-Training.cpp
# Opt level: O3

int main(void)

{
  void *pvVar1;
  double *pdVar2;
  Scalar SVar3;
  pointer pvVar4;
  ostream *poVar5;
  long lVar6;
  uint uVar7;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_09;
  initializer_list<double> __l_10;
  initializer_list<double> __l_11;
  initializer_list<double> __l_12;
  initializer_list<double> __l_13;
  initializer_list<double> __l_14;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_15;
  initializer_list<double> __l_16;
  MatrixXd se;
  MatrixXd y;
  vector<double,_std::allocator<double>_> or_labels;
  MatrixXd X;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  or_dataset;
  vector<double,_std::allocator<double>_> and_labels;
  vector<double,_std::allocator<double>_> xor_labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  and_dataset;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  xor_dataset;
  ANN n;
  allocator_type local_2cd;
  allocator_type local_2cc;
  allocator_type local_2cb;
  allocator_type local_2ca;
  allocator_type local_2c9;
  XprType local_2c8;
  MatrixXd local_2a8;
  long lStack_290;
  redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_288;
  vector<double,_std::allocator<double>_> vStack_270;
  vector<double,_std::allocator<double>_> local_258;
  vector<double,_std::allocator<double>_> local_240;
  DenseStorage<double,__1,__1,__1,_0> local_228;
  vector<double,_std::allocator<double>_> local_208;
  DenseStorage<double,__1,__1,__1,_0> local_1e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1c8;
  vector<double,_std::allocator<double>_> local_1a8;
  vector<double,_std::allocator<double>_> local_188;
  string local_168;
  string local_148;
  string local_128;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_108;
  double local_e8 [3];
  DenseStorage<double,__1,__1,__1,_0> local_d0;
  DenseStorage<double,__1,__1,__1,_0> local_b8;
  DenseStorage<double,__1,__1,__1,_0> local_a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_88;
  ANN local_70;
  
  ANN::ANN(&local_70);
  ANN::setInputSize(&local_70,2);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"tanh","");
  ANN::addLayer(&local_70,3,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"tanh","");
  ANN::addLayer(&local_70,3,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"tanh","");
  ANN::addLayer(&local_70,1,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_1e8.m_data = (double *)0x0;
  local_1e8.m_rows = 0;
  local_1e8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1e8,8,4,2);
  local_228.m_data = (double *)0x0;
  local_228.m_rows = 0;
  local_228.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_228,4,4,1);
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_188;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_288,__l,(allocator_type *)&local_208)
  ;
  local_108.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_108.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  local_108.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_108.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0x3ff00000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_108;
  std::vector<double,_std::allocator<double>_>::vector
            (&vStack_270,__l_00,(allocator_type *)&local_2c8);
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_1a8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_258,__l_01,(allocator_type *)&local_2a8);
  local_1c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_3ff0000000000000;
  local_1c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_3ff0000000000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_1c8;
  std::vector<double,_std::allocator<double>_>::vector(&local_240,__l_02,(allocator_type *)local_e8)
  ;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_288;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_88,__l_03,&local_2cd);
  lVar6 = 0x60;
  do {
    pvVar1 = *(void **)((long)&local_2a8.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows + lVar6);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_290 + lVar6) - (long)pvVar1);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  local_288.m_xpr = (XprType *)&DAT_3ff0000000000000;
  vStack_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbff0000000000000;
  local_288.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
       (Scalar *)0xbff0000000000000;
  local_288.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_outerStride.
  m_value = (long)&DAT_3ff0000000000000;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&local_288;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_188,__l_04,(allocator_type *)&local_108);
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_1a8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_288,__l_05,
             (allocator_type *)&local_2a8);
  local_1c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_3ff0000000000000;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&local_1c8;
  std::vector<double,_std::allocator<double>_>::vector
            (&vStack_270,__l_06,(allocator_type *)local_e8);
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&local_208;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_258,__l_07,(allocator_type *)&local_2cd);
  local_2c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3ff0000000000000;
  local_2c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0x3ff0000000000000;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_2c8;
  std::vector<double,_std::allocator<double>_>::vector(&local_240,__l_08,&local_2cb);
  __l_09._M_len = 4;
  __l_09._M_array = (iterator)&local_288;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_108,__l_09,&local_2cc);
  lVar6 = 0x60;
  do {
    pvVar1 = *(void **)((long)&local_2a8.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows + lVar6);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_290 + lVar6) - (long)pvVar1);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  local_288.m_xpr = (XprType *)0xbff0000000000000;
  vStack_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  local_288.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
       (Scalar *)0xbff0000000000000;
  local_288.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_outerStride.
  m_value = -0x4010000000000000;
  __l_10._M_len = 4;
  __l_10._M_array = (iterator)&local_288;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1a8,__l_10,(allocator_type *)&local_1c8);
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_11._M_len = 2;
  __l_11._M_array = (iterator)&local_208;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_288,__l_11,
             (allocator_type *)&local_2cd);
  local_2c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (Scalar *)0x0;
  local_2c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)&DAT_3ff0000000000000;
  __l_12._M_len = 2;
  __l_12._M_array = (iterator)&local_2c8;
  std::vector<double,_std::allocator<double>_>::vector(&vStack_270,__l_12,&local_2cb);
  local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&DAT_3ff0000000000000;
  local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  __l_13._M_len = 2;
  __l_13._M_array = (iterator)&local_2a8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_258,__l_13,(allocator_type *)&local_2cc);
  local_e8[0] = 1.0;
  local_e8[1] = 1.0;
  __l_14._M_len = 2;
  __l_14._M_array = local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_240,__l_14,&local_2c9);
  __l_15._M_len = 4;
  __l_15._M_array = (iterator)&local_288;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_1c8,__l_15,&local_2ca);
  lVar6 = 0x60;
  do {
    pvVar1 = *(void **)((long)&local_2a8.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows + lVar6);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_290 + lVar6) - (long)pvVar1);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  local_288.m_xpr = (XprType *)&DAT_3ff0000000000000;
  vStack_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  local_288.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
       (Scalar *)0xbff0000000000000;
  local_288.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_outerStride.
  m_value = (long)&DAT_3ff0000000000000;
  __l_16._M_len = 4;
  __l_16._M_array = (iterator)&local_288;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_208,__l_16,(allocator_type *)&local_2c8);
  lVar6 = 0;
  pvVar4 = local_1c8.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while ((lVar6 < local_1e8.m_rows && (0 < local_1e8.m_cols))) {
    pdVar2 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_1e8.m_data[lVar6] = *pdVar2;
    if ((local_1e8.m_cols == 1) ||
       ((local_1e8.m_data[local_1e8.m_rows + lVar6] = pdVar2[1], local_228.m_rows <= lVar6 ||
        (local_228.m_cols < 1)))) break;
    local_228.m_data[lVar6] =
         local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar6];
    lVar6 = lVar6 + 1;
    pvVar4 = pvVar4 + 1;
    if (lVar6 == 4) {
      uVar7 = 0;
      do {
        ANN::setLearningRate(&local_70,0.1);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_a0,&local_1e8);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_b8,&local_228);
        ANN::fit(&local_70,(MatrixXd *)&local_a0,(MatrixXd *)&local_b8);
        free(local_b8.m_data);
        free(local_a0.m_data);
        if ((ushort)(((ushort)((uVar7 & 0xffff) / 5) & 0xfffe) * -5 + (short)uVar7) == 0) {
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_d0,&local_1e8);
          ANN::predict(&local_2a8,&local_70,(MatrixXd *)&local_d0);
          if ((local_228.m_rows !=
               local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) ||
             (local_228.m_cols !=
              local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols)) {
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseBinaryOp.h"
                          ,0x6e,
                          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                         );
          }
          if ((local_228.m_cols | local_228.m_rows) < 0) {
            __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                          ,0x4a,
                          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, -1>]"
                         );
          }
          local_288.m_evaluator.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
          m_outerStride.m_value = (long)&local_228;
          local_288.m_xpr = &local_2a8;
          vStack_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_228.m_rows;
          vStack_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_228.m_cols;
          local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_2c8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                      *)&local_288);
          free(local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          free(local_d0.m_data);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
          if ((local_2c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows < 1) ||
             (local_2c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols < 1)) {
            __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Redux.h"
                          ,0x19d,
                          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, -1>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                         );
          }
          local_288.m_evaluator.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data
               = local_2c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
          local_288.m_evaluator.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
          m_outerStride.m_value =
               local_2c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
          local_288.m_xpr = &local_2c8;
          SVar3 = Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_3,_0>
                  ::run(&local_288,(scalar_sum_op<double,_double> *)&local_2a8);
          poVar5 = std::ostream::_M_insert<double>
                             (SVar3 / (double)(local_2c8.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               .m_storage.m_cols *
                                              local_2c8.
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                              .m_storage.m_rows));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          free(local_2c8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
        }
        uVar7 = uVar7 + 1;
        if (uVar7 == 2000) {
          if (local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_208.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_208.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_1c8);
          if (local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_108);
          if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_188.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_188.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_88);
          free(local_228.m_data);
          free(local_1e8.m_data);
          ANN::~ANN(&local_70);
          return 0;
        }
      } while( true );
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x16d,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
               );
}

Assistant:

int main() 
{
    ANN n = ANN();
    n.setInputSize(2);
    n.addLayer(3, "tanh");
    n.addLayer(3, "tanh");
    n.addLayer(1, "tanh");

    Eigen::MatrixXd X = Eigen::MatrixXd(4, 2);
    Eigen::MatrixXd y = Eigen::MatrixXd(4, 1);
    
    double learning_rate = 0.1;

    vector<vector<double>> xor_dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> xor_labels = {-1, 1, 1, -1};

    vector<vector<double>> and_dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> and_labels = {-1, -1, -1, 1};

    vector<vector<double>> or_dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> or_labels = {-1, 1, 1, 1};
    
    for(int j = 0; j < 4; j++) {
        X(j,0) = or_dataset[j][0];
        X(j,1) = or_dataset[j][1];
        y(j,0) = or_labels[j];
    }

    for(int i = 0; i < 2000; i++) {
        n.setLearningRate(learning_rate);
        n.fit(X, y);
        if(i % 10 == 0) {
            Eigen::MatrixXd se = (y - n.predict(X)).array().pow(2);
            cout << i << "," << se.mean() << endl;
        }
    }
    
    return 0;
}